

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_ValidationError_Test::
~ParseEditionsTest_ValidationError_Test(ParseEditionsTest_ValidationError_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, ValidationError) {
  ExpectHasValidationErrors(
      R"schema(
        edition = "2023";
        option features.field_presence = IMPLICIT;
        option java_package = "blah";
        message TestMessage {
          string foo = 1 [default = "hello"];
        })schema",
      "5:17: Implicit presence fields can't specify defaults.\n");
}